

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

void duckdb::RadixSortLSD
               (BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *sorting_size)

{
  idx_t iVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  data_ptr_t pdVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t size;
  data_ptr_t pdVar9;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  idx_t iVar13;
  ulong uVar14;
  AllocatedData temp_block;
  idx_t counts [256];
  AllocatedData local_850;
  ulong local_838 [257];
  
  iVar3 = (*buffer_manager->_vptr_BufferManager[0x14])();
  iVar13 = *row_width;
  iVar1 = *count;
  pdVar4 = Allocator::AllocateData((Allocator *)CONCAT44(extraout_var,iVar3),iVar13 * iVar1);
  AllocatedData::AllocatedData
            (&local_850,(Allocator *)CONCAT44(extraout_var,iVar3),pdVar4,iVar13 * iVar1);
  iVar13 = *sorting_size;
  if (iVar13 != 0) {
    uVar14 = *count;
    uVar10 = 1;
    bVar11 = false;
    do {
      switchD_01043a80::default(local_838,0,0x800);
      pdVar9 = local_850.pointer;
      pdVar4 = *dataptr;
      if (bVar11) {
        pdVar9 = *dataptr;
        pdVar4 = local_850.pointer;
      }
      lVar12 = (iVar13 - uVar10) + *col_offset;
      if (uVar14 == 0) {
        uVar6 = 0;
      }
      else {
        pbVar5 = pdVar4 + lVar12;
        iVar1 = *row_width;
        uVar8 = uVar14;
        do {
          local_838[*pbVar5] = local_838[*pbVar5] + 1;
          pbVar5 = pbVar5 + iVar1;
          uVar8 = uVar8 - 1;
          uVar6 = local_838[0];
        } while (uVar8 != 0);
      }
      lVar7 = 1;
      uVar8 = uVar6;
      do {
        uVar2 = local_838[lVar7];
        if (uVar8 <= uVar2) {
          uVar8 = uVar2;
        }
        uVar6 = uVar6 + uVar2;
        local_838[lVar7] = uVar6;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      if (uVar8 != uVar14) {
        if (uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          size = *row_width;
          pdVar4 = pdVar4 + (uVar14 - 1) * size;
          uVar6 = 0;
          do {
            uVar14 = local_838[pdVar4[lVar12]];
            local_838[pdVar4[lVar12]] = uVar14 - 1;
            FastMemcpy(pdVar9 + (uVar14 - 1) * size,pdVar4,size);
            size = *row_width;
            pdVar4 = pdVar4 + -size;
            uVar6 = uVar6 + 1;
            uVar14 = *count;
          } while (uVar6 < uVar14);
          iVar13 = *sorting_size;
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 <= iVar13);
    if (bVar11) {
      switchD_015de399::default(*dataptr,local_850.pointer,*row_width * *count);
    }
  }
  AllocatedData::~AllocatedData(&local_850);
  return;
}

Assistant:

void RadixSortLSD(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &sorting_size) {
	auto temp_block = buffer_manager.GetBufferAllocator().Allocate(count * row_width);
	bool swap = false;

	idx_t counts[SortConstants::VALUES_PER_RADIX];
	for (idx_t r = 1; r <= sorting_size; r++) {
		// Init counts to 0
		memset(counts, 0, sizeof(counts));
		// Const some values for convenience
		const data_ptr_t source_ptr = swap ? temp_block.get() : dataptr;
		const data_ptr_t target_ptr = swap ? dataptr : temp_block.get();
		const idx_t offset = col_offset + sorting_size - r;
		// Collect counts
		data_ptr_t offset_ptr = source_ptr + offset;
		for (idx_t i = 0; i < count; i++) {
			counts[*offset_ptr]++;
			offset_ptr += row_width;
		}
		// Compute offsets from counts
		idx_t max_count = counts[0];
		for (idx_t val = 1; val < SortConstants::VALUES_PER_RADIX; val++) {
			max_count = MaxValue<idx_t>(max_count, counts[val]);
			counts[val] = counts[val] + counts[val - 1];
		}
		if (max_count == count) {
			continue;
		}
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr + (count - 1) * row_width;
		for (idx_t i = 0; i < count; i++) {
			idx_t &radix_offset = --counts[*(row_ptr + offset)];
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr -= row_width;
		}
		swap = !swap;
	}
	// Move data back to original buffer (if it was swapped)
	if (swap) {
		memcpy(dataptr, temp_block.get(), count * row_width);
	}
}